

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

Value<char> * __thiscall Qentem::Value<char>::GetValue(Value<char> *this,char *key,SizeT length)

{
  char *pcVar1;
  ValueType VVar2;
  Value<char> *pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (; VVar2 = this->type_, VVar2 == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (VVar2 == Array) {
    if (length == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)((int)*key - 0x30);
      if (length != 1) {
        uVar5 = 1;
        do {
          pcVar1 = key + uVar5;
          uVar5 = uVar5 + 1;
          uVar4 = (ulong)(uint)(*pcVar1 + -0x30 + (int)uVar4 * 10);
        } while (length != uVar5);
      }
    }
    if (((uint)uVar4 < (this->field_0).array_.index_) &&
       (pVVar3 = (this->field_0).array_.storage_, pVVar3[uVar4].type_ != Undefined)) {
      return pVVar3 + uVar4;
    }
  }
  else if (((VVar2 == Object) &&
           (pVVar3 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::GetValue
                               ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,key,
                                length), pVVar3 != (Value<char> *)0x0)) &&
          (pVVar3->type_ != Undefined)) {
    return pVVar3;
  }
  return (Value<char> *)0x0;
}

Assistant:

Value *GetValue(const Char_T *key, SizeT length) const noexcept {
        switch (Type()) {
            case ValueType::Object: {
                Value *val = object_.GetValue(key, length);

                if ((val != nullptr) && !(val->isUndefined())) {
                    return val;
                }

                return nullptr;
            }

            case ValueType::Array: {
                SizeT index;
                Digit::FastStringToNumber(index, key, length);

                if (index < array_.Size()) {
                    Value *val = (array_.Storage() + index);

                    if (!(val->isUndefined())) {
                        return val;
                    }
                }

                return nullptr;
            }

            case ValueType::ValuePtr: {
                return value_->GetValue(key, length);
            }

            default:
                return nullptr;
        }
    }